

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O1

void __thiscall re2::RE2::Init(RE2 *this,StringPiece *pattern,Options *options)

{
  Encoding EVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  ParseFlags global_flags;
  uint uVar10;
  string *psVar11;
  Regexp *pRVar12;
  string *__return_storage_ptr__;
  Prog *pPVar13;
  ostream *poVar14;
  undefined8 uVar15;
  RegexpStatusCode RVar16;
  const_pointer pcVar17;
  const_pointer pcVar18;
  long *in_FS_OFFSET;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  bool foldcase;
  RegexpStatus status;
  Regexp *suffix;
  bool local_219;
  long *local_218;
  long local_210;
  long local_208 [2];
  RegexpStatus local_1f8;
  string local_1d8;
  Regexp *local_1b8;
  size_type local_1b0;
  LogMessage local_1a8;
  
  local_1a8._0_8_ = &local_1f8;
  *in_FS_OFFSET = (long)&local_1a8;
  *in_FS_OFFSET =
       (long)std::once_flag::_Prepare_execution::
             _Prepare_execution<(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/mutex:775:25)>
             ::anon_class_1_0_00000001::__invoke;
  iVar9 = pthread_once(&Init::empty_once._M_once,__once_proxy);
  if (iVar9 == 0) {
    *in_FS_OFFSET = 0;
    *in_FS_OFFSET = 0;
    psVar11 = (string *)operator_new(0x20);
    pcVar18 = pattern->data_;
    pcVar17 = pcVar18;
    if (pcVar18 != (const_pointer)0x0) {
      pcVar17 = (const_pointer)pattern->size_;
    }
    (psVar11->_M_dataplus)._M_p = (pointer)&psVar11->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)psVar11,pcVar18,pcVar17 + (long)pcVar18);
    this->pattern_ = psVar11;
    EVar1 = options->encoding_;
    bVar8 = options->posix_syntax_;
    bVar2 = options->longest_match_;
    bVar3 = options->log_errors_;
    bVar4 = options->literal_;
    (this->options_).max_mem_ = options->max_mem_;
    (this->options_).encoding_ = EVar1;
    (this->options_).posix_syntax_ = bVar8;
    (this->options_).longest_match_ = bVar2;
    (this->options_).log_errors_ = bVar3;
    (this->options_).literal_ = bVar4;
    bVar8 = options->never_nl_;
    bVar2 = options->dot_nl_;
    bVar3 = options->never_capture_;
    bVar4 = options->case_sensitive_;
    bVar5 = options->perl_classes_;
    bVar6 = options->word_boundary_;
    bVar7 = options->one_line_;
    (this->options_).literal_ = options->literal_;
    (this->options_).never_nl_ = bVar8;
    (this->options_).dot_nl_ = bVar2;
    (this->options_).never_capture_ = bVar3;
    (this->options_).case_sensitive_ = bVar4;
    (this->options_).perl_classes_ = bVar5;
    (this->options_).word_boundary_ = bVar6;
    (this->options_).one_line_ = bVar7;
    this->entire_regexp_ = (Regexp *)0x0;
    this->suffix_regexp_ = (Regexp *)0x0;
    this->error_ = (string *)empty_storage;
    this->error_arg_ = (string *)empty_storage;
    this->num_captures_ = -1;
    *(uint *)&this->field_0x44 = (uint)(this->options_).longest_match_ << 0x1d;
    (this->prefix_)._M_string_length = 0;
    *(this->prefix_)._M_dataplus._M_p = '\0';
    this->named_groups_ =
         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *)0x0;
    this->group_names_ =
         (map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x0;
    this->prog_ = (Prog *)0x0;
    this->rprog_ = (Prog *)0x0;
    local_1f8.code_ = kRegexpSuccess;
    local_1f8.error_arg_.data_ = (const_pointer)0x0;
    local_1f8.error_arg_.size_ = 0;
    local_1f8.tmp_ = (string *)0x0;
    local_1a8._0_8_ = (this->pattern_->_M_dataplus)._M_p;
    local_1a8.str_.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)this->pattern_->_M_string_length;
    global_flags = Options::ParseFlags(&this->options_);
    pRVar12 = Regexp::Parse((StringPiece *)&local_1a8,global_flags,&local_1f8);
    this->entire_regexp_ = pRVar12;
    if (pRVar12 == (Regexp *)0x0) {
      if ((this->options_).log_errors_ == true) {
        LogMessage::LogMessage
                  (&local_1a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/re2-src/re2/re2.cc"
                   ,0xe7);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&local_1a8.str_.super_basic_ostream<char,_std::char_traits<char>_>,
                   "Error parsing \'",0xf);
        local_1b8 = (Regexp *)(this->pattern_->_M_dataplus)._M_p;
        local_1b0 = this->pattern_->_M_string_length;
        trunc_abi_cxx11_((re2 *)&local_218,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
        poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                            (&local_1a8.str_.super_basic_ostream<char,_std::char_traits<char>_>,
                             (char *)local_218,local_210);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\': ",3);
        RegexpStatus::Text_abi_cxx11_(&local_1d8,&local_1f8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        if (local_218 != local_208) {
          operator_delete(local_218,local_208[0] + 1);
        }
        LogMessage::~LogMessage(&local_1a8);
      }
      __return_storage_ptr__ = (string *)operator_new(0x20);
      RegexpStatus::Text_abi_cxx11_(__return_storage_ptr__,&local_1f8);
      this->error_ = (string *)__return_storage_ptr__;
      RVar16 = kRegexpInternalError;
      if (local_1f8.code_ < (kRegexpBadNamedCapture|kRegexpInternalError)) {
        RVar16 = local_1f8.code_;
      }
      *(RegexpStatusCode *)&this->field_0x44 =
           *(RegexpStatusCode *)&this->field_0x44 & 0xe0000000 | RVar16;
      psVar11 = (string *)operator_new(0x20);
      pcVar18 = local_1f8.error_arg_.data_;
      if (local_1f8.error_arg_.data_ != (const_pointer)0x0) {
        pcVar18 = (const_pointer)local_1f8.error_arg_.size_;
      }
      (psVar11->_M_dataplus)._M_p = (pointer)&psVar11->field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)psVar11,local_1f8.error_arg_.data_,
                 pcVar18 + (long)local_1f8.error_arg_.data_);
      this->error_arg_ = psVar11;
    }
    else {
      bVar8 = Regexp::RequiredPrefix(pRVar12,(string *)&this->prefix_,&local_219,&local_1b8);
      if (bVar8) {
        *(uint *)&this->field_0x44 =
             *(uint *)&this->field_0x44 & 0x7fffffff | (uint)local_219 << 0x1f;
        pRVar12 = local_1b8;
      }
      else {
        pRVar12 = Regexp::Incref(this->entire_regexp_);
      }
      this->suffix_regexp_ = pRVar12;
      pPVar13 = Regexp::CompileToProg(pRVar12,((this->options_).max_mem_ * 2) / 3);
      this->prog_ = pPVar13;
      if (pPVar13 == (Prog *)0x0) {
        if ((this->options_).log_errors_ == true) {
          LogMessage::LogMessage
                    (&local_1a8,
                     "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/re2-src/re2/re2.cc"
                     ,0x100);
          std::__ostream_insert<char,std::char_traits<char>>
                    (&local_1a8.str_.super_basic_ostream<char,_std::char_traits<char>_>,
                     "Error compiling \'",0x11);
          local_1d8._M_dataplus._M_p = (this->pattern_->_M_dataplus)._M_p;
          local_1d8._M_string_length = this->pattern_->_M_string_length;
          trunc_abi_cxx11_((re2 *)&local_218,
                           (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00));
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                              (&local_1a8.str_.super_basic_ostream<char,_std::char_traits<char>_>,
                               (char *)local_218,local_210);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\'",1);
          if (local_218 != local_208) {
            operator_delete(local_218,local_208[0] + 1);
          }
          LogMessage::~LogMessage(&local_1a8);
        }
        psVar11 = (string *)operator_new(0x20);
        (psVar11->_M_dataplus)._M_p = (pointer)&psVar11->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)psVar11,"pattern too large - compile failed","");
        this->error_ = psVar11;
        uVar10 = *(uint *)&this->field_0x44 & 0xe0000000 | 0xf;
      }
      else {
        iVar9 = Regexp::NumCaptures(this->suffix_regexp_);
        this->num_captures_ = iVar9;
        bVar8 = Prog::IsOnePass(this->prog_);
        uVar10 = *(uint *)&this->field_0x44 & 0xbfffffff | (uint)bVar8 << 0x1e;
      }
      *(uint *)&this->field_0x44 = uVar10;
    }
    RegexpStatus::~RegexpStatus(&local_1f8);
    return;
  }
  uVar15 = std::__throw_system_error(iVar9);
  LogMessage::~LogMessage(&local_1a8);
  RegexpStatus::~RegexpStatus(&local_1f8);
  _Unwind_Resume(uVar15);
}

Assistant:

void RE2::Init(const StringPiece& pattern, const Options& options) {
  static std::once_flag empty_once;
  std::call_once(empty_once, []() {
    (void) new (empty_storage) EmptyStorage;
  });

  pattern_ = new std::string(pattern);
  options_.Copy(options);
  entire_regexp_ = NULL;
  suffix_regexp_ = NULL;
  error_ = empty_string();
  error_arg_ = empty_string();

  num_captures_ = -1;
  error_code_ = NoError;
  longest_match_ = options_.longest_match();
  is_one_pass_ = false;
  prefix_foldcase_ = false;
  prefix_.clear();
  prog_ = NULL;

  rprog_ = NULL;
  named_groups_ = NULL;
  group_names_ = NULL;

  RegexpStatus status;
  entire_regexp_ = Regexp::Parse(
    *pattern_,
    static_cast<Regexp::ParseFlags>(options_.ParseFlags()),
    &status);
  if (entire_regexp_ == NULL) {
    if (options_.log_errors()) {
      LOG(ERROR) << "Error parsing '" << trunc(*pattern_) << "': "
                 << status.Text();
    }
    error_ = new std::string(status.Text());
    error_code_ = RegexpErrorToRE2(status.code());
    error_arg_ = new std::string(status.error_arg());
    return;
  }

  bool foldcase;
  re2::Regexp* suffix;
  if (entire_regexp_->RequiredPrefix(&prefix_, &foldcase, &suffix)) {
    prefix_foldcase_ = foldcase;
    suffix_regexp_ = suffix;
  }
  else {
    suffix_regexp_ = entire_regexp_->Incref();
  }

  // Two thirds of the memory goes to the forward Prog,
  // one third to the reverse prog, because the forward
  // Prog has two DFAs but the reverse prog has one.
  prog_ = suffix_regexp_->CompileToProg(options_.max_mem()*2/3);
  if (prog_ == NULL) {
    if (options_.log_errors())
      LOG(ERROR) << "Error compiling '" << trunc(*pattern_) << "'";
    error_ = new std::string("pattern too large - compile failed");
    error_code_ = RE2::ErrorPatternTooLarge;
    return;
  }

  // We used to compute this lazily, but it's used during the
  // typical control flow for a match call, so we now compute
  // it eagerly, which avoids the overhead of std::once_flag.
  num_captures_ = suffix_regexp_->NumCaptures();

  // Could delay this until the first match call that
  // cares about submatch information, but the one-pass
  // machine's memory gets cut from the DFA memory budget,
  // and that is harder to do if the DFA has already
  // been built.
  is_one_pass_ = prog_->IsOnePass();
}